

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

aiColor4D Read<aiColor4t<float>>(IOStream *stream)

{
  aiColor4D aVar1;
  float fVar2;
  IOStream *stream_local;
  aiColor4D c;
  
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)&stream_local);
  stream_local._0_4_ = Read<float>(stream);
  stream_local._4_4_ = Read<float>(stream);
  c.r = Read<float>(stream);
  fVar2 = Read<float>(stream);
  aVar1.g = stream_local._4_4_;
  aVar1.r = stream_local._0_4_;
  aVar1.b = c.r;
  aVar1.a = fVar2;
  return aVar1;
}

Assistant:

aiColor4D Read<aiColor4D>(IOStream * stream) {
    aiColor4D c;
    c.r = Read<float>(stream);
    c.g = Read<float>(stream);
    c.b = Read<float>(stream);
    c.a = Read<float>(stream);
    return c;
}